

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Textures.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::createTexture_scale(SemanticParser *this,SP *in)

{
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  element_type *peVar4;
  float *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  element_type *in_RDI;
  float v;
  SP SVar5;
  SP tex;
  undefined4 in_stack_fffffffffffffce8;
  float in_stack_fffffffffffffcec;
  ParamSet *in_stack_fffffffffffffcf0;
  string *in_stack_fffffffffffffcf8;
  ParamSet *in_stack_fffffffffffffd00;
  string *in_stack_fffffffffffffd20;
  string *psVar6;
  ParamSet *in_stack_fffffffffffffd28;
  ParamSet *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  SemanticParser *in_stack_fffffffffffffd48;
  SemanticParser *this_02;
  float in_stack_fffffffffffffd8c;
  string *in_stack_fffffffffffffd90;
  ParamSet *in_stack_fffffffffffffd98;
  ParamSet *this_03;
  ParamSet *in_stack_fffffffffffffde8;
  string local_210 [32];
  vec3f local_1f0;
  allocator<char> local_1e1;
  string local_1e0 [39];
  undefined1 local_1b9 [40];
  allocator<char> local_191;
  string local_190 [71];
  allocator<char> local_149;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [32];
  vec3f local_100;
  allocator<char> local_f1;
  string local_f0 [39];
  undefined1 local_c9 [40];
  allocator<char> local_a1;
  string local_a0 [87];
  undefined1 local_49 [73];
  
  std::make_shared<pbrt::ScaleTexture>();
  peVar3 = std::
           __shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b25d4);
  this_03 = &peVar3->super_ParamSet;
  psVar6 = (string *)local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28,
             (allocator<char> *)in_stack_fffffffffffffd20);
  bVar1 = syntactic::ParamSet::hasParamTexture(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  if (bVar1) {
    std::__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1b2668);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28,
               (allocator<char> *)in_stack_fffffffffffffd20);
    syntactic::ParamSet::getParamTexture(in_stack_fffffffffffffde8,psVar6);
    findOrCreateTexture(in_stack_fffffffffffffd48,
                        (SP *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
    std::__shared_ptr_access<pbrt::ScaleTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::ScaleTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b26f2);
    std::shared_ptr<pbrt::Texture>::operator=
              ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffcf0,
               (shared_ptr<pbrt::Texture> *)
               CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1b2713);
    std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::Texture> *)0x1b2720);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  else {
    peVar3 = std::
             __shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b2801);
    in_stack_fffffffffffffd90 = (string *)&peVar3->super_ParamSet;
    in_stack_fffffffffffffd98 = (ParamSet *)local_c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28,
               (allocator<char> *)in_stack_fffffffffffffd20);
    bVar1 = syntactic::ParamSet::hasParam3f(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    in_stack_fffffffffffffd8c = (float)CONCAT13(bVar1,SUB43(in_stack_fffffffffffffd8c,0));
    std::__cxx11::string::~string((string *)(local_c9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_c9);
    if (((uint)in_stack_fffffffffffffd8c & 0x1000000) == 0) {
      std::__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1b29ca);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28,
                 (allocator<char> *)in_stack_fffffffffffffd20);
      v = syntactic::ParamSet::getParam1f
                    (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
      math::vec3f::vec3f(&local_100,v);
      peVar4 = std::
               __shared_ptr_access<pbrt::ScaleTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pbrt::ScaleTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b2a45);
      (peVar4->scale1).x = local_100.x;
      (peVar4->scale1).y = local_100.y;
      (peVar4->scale1).z = local_100.z;
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator(&local_121);
    }
    else {
      std::__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1b2895);
      std::__shared_ptr_access<pbrt::ScaleTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::ScaleTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1b28ae);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28,
                 (allocator<char> *)in_stack_fffffffffffffd20);
      syntactic::ParamSet::getParam3f(this_03,in_RDX,in_RSI);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator(&local_f1);
    }
  }
  peVar3 = std::
           __shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b2acf);
  this_02 = (SemanticParser *)&peVar3->super_ParamSet;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28,
             (allocator<char> *)in_stack_fffffffffffffd20);
  bVar2 = syntactic::ParamSet::hasParamTexture(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  if ((bVar2 & 1) == 0) {
    peVar3 = std::
             __shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b2cde);
    psVar6 = (string *)&peVar3->super_ParamSet;
    this_00 = (ParamSet *)local_1b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd30,(char *)this_00,(allocator<char> *)psVar6);
    bVar1 = syntactic::ParamSet::hasParam3f(this_00,psVar6);
    std::__cxx11::string::~string((string *)(local_1b9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1b9);
    if (bVar1) {
      std::__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1b2d60);
      std::__shared_ptr_access<pbrt::ScaleTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::ScaleTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1b2d76);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd30,(char *)this_00,(allocator<char> *)psVar6);
      syntactic::ParamSet::getParam3f(this_03,in_RDX,in_RSI);
      std::__cxx11::string::~string(local_1e0);
      std::allocator<char>::~allocator(&local_1e1);
    }
    else {
      peVar3 = std::
               __shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1b2e83);
      in_stack_fffffffffffffcf0 = &peVar3->super_ParamSet;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd30,(char *)this_00,(allocator<char> *)psVar6);
      in_stack_fffffffffffffcec =
           syntactic::ParamSet::getParam1f
                     (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c)
      ;
      math::vec3f::vec3f(&local_1f0,in_stack_fffffffffffffcec);
      peVar4 = std::
               __shared_ptr_access<pbrt::ScaleTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pbrt::ScaleTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b2ef8);
      (peVar4->scale2).x = local_1f0.x;
      (peVar4->scale2).y = local_1f0.y;
      (peVar4->scale2).z = local_1f0.z;
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdef);
    }
  }
  else {
    peVar3 = std::
             __shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b2b51);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &peVar3->super_ParamSet;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)in_stack_fffffffffffffd28,
               (allocator<char> *)in_stack_fffffffffffffd20);
    syntactic::ParamSet::getParamTexture(in_stack_fffffffffffffde8,psVar6);
    findOrCreateTexture(this_02,(SP *)CONCAT17(bVar2,in_stack_fffffffffffffd40));
    std::__shared_ptr_access<pbrt::ScaleTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::ScaleTexture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b2bcf);
    std::shared_ptr<pbrt::Texture>::operator=
              ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffcf0,
               (shared_ptr<pbrt::Texture> *)
               CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1b2bf0);
    std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::Texture> *)0x1b2bfd);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator(&local_191);
  }
  std::shared_ptr<pbrt::Texture>::shared_ptr<pbrt::ScaleTexture,void>
            ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffcf0,
             (shared_ptr<pbrt::ScaleTexture> *)
             CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  std::shared_ptr<pbrt::ScaleTexture>::~shared_ptr((shared_ptr<pbrt::ScaleTexture> *)0x1b2f94);
  SVar5.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar5.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SP)SVar5.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Texture::SP SemanticParser::createTexture_scale(pbrt::syntactic::Texture::SP in)
  {
    ScaleTexture::SP tex = std::make_shared<ScaleTexture>();
    if (in->hasParamTexture("tex1"))
      tex->tex1 = findOrCreateTexture(in->getParamTexture("tex1"));
    else if (in->hasParam3f("tex1"))
      in->getParam3f(&tex->scale1.x,"tex1");
    else
      tex->scale1 = vec3f(in->getParam1f("tex1"));
          
    if (in->hasParamTexture("tex2"))
      tex->tex2 = findOrCreateTexture(in->getParamTexture("tex2"));
    else if (in->hasParam3f("tex2"))
      in->getParam3f(&tex->scale2.x,"tex2");
    else
      tex->scale2 = vec3f(in->getParam1f("tex2"));
    return tex;
  }